

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  type tVar1;
  int iVar2;
  char *pcVar3;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_20;
  char *local_18;
  
  local_18 = begin + 1;
  if (local_18 == end) {
LAB_00134c45:
    pcVar3 = "missing precision specifier";
  }
  else {
    if ((int)*local_18 - 0x30U < 10) {
      iVar2 = parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                        (&local_18,end,handler);
      ((handler->
       super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
       ).super_specs_setter<char>.specs_)->precision = iVar2;
    }
    else {
      if (*local_18 != '{') goto LAB_00134c45;
      pcVar3 = begin + 2;
      if (pcVar3 != end) {
        local_20.handler = handler;
        pcVar3 = parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                           (pcVar3,end,&local_20);
      }
      if ((pcVar3 == end) || (local_18 = pcVar3 + 1, *pcVar3 != '}')) {
        pcVar3 = "invalid format string";
        goto LAB_00134c5e;
      }
    }
    tVar1 = (handler->checker_).arg_type_;
    if ((tVar1 != pointer_type) && (8 < tVar1 - named_arg_type)) {
      return local_18;
    }
    pcVar3 = "precision not allowed for this argument type";
  }
LAB_00134c5e:
  error_handler::on_error((error_handler *)&local_20,pcVar3);
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}